

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

void Node_fprint(FILE *stream,Node *node)

{
  Node *local_18;
  Node *node_local;
  FILE *stream_local;
  
  if (node != (Node *)0x0) {
    switch(node->type) {
    case 1:
      fprintf((FILE *)stream," %s",(node->rule).name);
      break;
    default:
      fprintf((FILE *)stream,"\nunknown node type %d\n",(ulong)(uint)node->type);
      exit(1);
    case 3:
      fprintf((FILE *)stream," %s",*(undefined8 *)((node->rule).name + 0x18));
      break;
    case 4:
      fprintf((FILE *)stream," .");
      break;
    case 5:
      fprintf((FILE *)stream," \'%s\'",(node->rule).name);
      break;
    case 6:
      fprintf((FILE *)stream," \"%s\"",(node->rule).name);
      break;
    case 7:
      fprintf((FILE *)stream," [%s]",(node->rule).name);
      break;
    case 8:
      fprintf((FILE *)stream," { %s }",(node->rule).name);
      break;
    case 9:
      fprintf((FILE *)stream," ?{ %s }",(node->rule).name);
      break;
    case 10:
      local_18 = (node->name).rule;
      fprintf((FILE *)stream," (");
      Node_fprint(stream,local_18);
      while (local_18 = (local_18->rule).next, local_18 != (Node *)0x0) {
        fprintf((FILE *)stream," |");
        Node_fprint(stream,local_18);
      }
      fprintf((FILE *)stream," )");
      break;
    case 0xb:
      local_18 = (node->name).rule;
      fprintf((FILE *)stream," (");
      Node_fprint(stream,local_18);
      while (local_18 = (local_18->rule).next, local_18 != (Node *)0x0) {
        Node_fprint(stream,local_18);
      }
      fprintf((FILE *)stream," )");
      break;
    case 0xc:
      fprintf((FILE *)stream,"&");
      Node_fprint(stream,(node->name).rule);
      break;
    case 0xd:
      fprintf((FILE *)stream,"!");
      Node_fprint(stream,(node->name).rule);
      break;
    case 0xe:
      Node_fprint(stream,(node->name).rule);
      fprintf((FILE *)stream,"?");
      break;
    case 0xf:
      Node_fprint(stream,(node->name).rule);
      fprintf((FILE *)stream,"*");
      break;
    case 0x10:
      Node_fprint(stream,(node->name).rule);
      fprintf((FILE *)stream,"+");
    }
    return;
  }
  __assert_fail("node",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/3rd/greg/tree.c"
                ,0x132,"void Node_fprint(FILE *, Node *)");
}

Assistant:

static void Node_fprint(FILE *stream, Node *node)
{
  assert(node);
  switch (node->type)
    {
    case Rule:		fprintf(stream, " %s", node->rule.name);				break;
    case Name:		fprintf(stream, " %s", node->name.rule->rule.name);			break;
    case Dot:		fprintf(stream, " .");							break;
    case Character:	fprintf(stream, " '%s'", node->character.value);			break;
    case String:	fprintf(stream, " \"%s\"", node->string.value);				break;
    case Class:		fprintf(stream, " [%s]", node->cclass.value);				break;
    case Action:	fprintf(stream, " { %s }", node->action.text);				break;
    case Predicate:	fprintf(stream, " ?{ %s }", node->action.text);				break;

    case Alternate:	node= node->alternate.first;
			fprintf(stream, " (");
			Node_fprint(stream, node);
			while ((node= node->any.next))
			  {
			    fprintf(stream, " |");
			    Node_fprint(stream, node);
			  }
			fprintf(stream, " )");
			break;

    case Sequence:	node= node->sequence.first;
			fprintf(stream, " (");
			Node_fprint(stream, node);
			while ((node= node->any.next))
			  Node_fprint(stream, node);
			fprintf(stream, " )");
			break;

    case PeekFor:	fprintf(stream, "&");  Node_fprint(stream, node->query.element);	break;
    case PeekNot:	fprintf(stream, "!");  Node_fprint(stream, node->query.element);	break;
    case Query:		Node_fprint(stream, node->query.element);  fprintf(stream, "?");	break;
    case Star:		Node_fprint(stream, node->query.element);  fprintf(stream, "*");	break;
    case Plus:		Node_fprint(stream, node->query.element);  fprintf(stream, "+");	break;
    default:
      fprintf(stream, "\nunknown node type %d\n", node->type);
      exit(1);
    }
}